

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

Symbol __thiscall
google::protobuf::DescriptorBuilder::LookupSymbol
          (DescriptorBuilder *this,string_view name,string_view relative_to,
          PlaceholderType placeholder_type,ResolveMode resolve_mode,bool build_it)

{
  Symbol SVar1;
  
  SVar1 = LookupSymbolNoPlaceholder(this,name,relative_to,resolve_mode,build_it);
  if (((SVar1.ptr_)->symbol_type_ == '\0') && (this->pool_->allow_unknown_ == true)) {
    SVar1 = DescriptorPool::NewPlaceholderWithMutexHeld(this->pool_,name,placeholder_type);
    return (Symbol)SVar1.ptr_;
  }
  return (Symbol)SVar1.ptr_;
}

Assistant:

Symbol DescriptorBuilder::LookupSymbol(
    const absl::string_view name, const absl::string_view relative_to,
    DescriptorPool::PlaceholderType placeholder_type, ResolveMode resolve_mode,
    bool build_it) {
  Symbol result =
      LookupSymbolNoPlaceholder(name, relative_to, resolve_mode, build_it);
  if (result.IsNull() && pool_->allow_unknown_) {
    // Not found, but AllowUnknownDependencies() is enabled.  Return a
    // placeholder instead.
    result = pool_->NewPlaceholderWithMutexHeld(name, placeholder_type);
  }
  return result;
}